

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::JunitReporter::writeTestCase(JunitReporter *this,TestCaseNode *testCaseNode)

{
  SectionNode *sectionNode;
  pointer pbVar1;
  size_type sVar2;
  long lVar3;
  long lVar4;
  pointer pbVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  string className;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  sectionNode = (((testCaseNode->children).
                  super__Vector_base<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>,_std::allocator<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->
                super___shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode,_(__gnu_cxx::_Lock_policy)2>
                )._M_ptr;
  std::__cxx11::string::string
            ((string *)&className,(string *)&(testCaseNode->value).testInfo.className);
  if (className._M_string_length != 0) goto LAB_0018e853;
  pbVar5 = (testCaseNode->value).testInfo.tags.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (testCaseNode->value).testInfo.tags.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  lVar3 = (long)pbVar1 - (long)pbVar5;
  for (lVar4 = lVar3 >> 7; 0 < lVar4; lVar4 = lVar4 + -1) {
    if (*(pbVar5->_M_dataplus)._M_p == '#') goto LAB_0018e7f9;
    if (*pbVar5[1]._M_dataplus._M_p == '#') {
      pbVar5 = pbVar5 + 1;
      goto LAB_0018e7f9;
    }
    if (*pbVar5[2]._M_dataplus._M_p == '#') {
      pbVar5 = pbVar5 + 2;
      goto LAB_0018e7f9;
    }
    if (*pbVar5[3]._M_dataplus._M_p == '#') {
      pbVar5 = pbVar5 + 3;
      goto LAB_0018e7f9;
    }
    pbVar5 = pbVar5 + 4;
    lVar3 = lVar3 + -0x80;
  }
  lVar3 = lVar3 >> 5;
  if (lVar3 == 1) {
LAB_0018e7dd:
    if (*(pbVar5->_M_dataplus)._M_p != '#') {
      pbVar5 = pbVar1;
    }
LAB_0018e7f9:
    if (pbVar5 == pbVar1) goto LAB_0018e80e;
    std::__cxx11::string::substr((ulong)&local_a8,(ulong)pbVar5);
  }
  else {
    if (lVar3 == 2) {
LAB_0018e7d1:
      if (*(pbVar5->_M_dataplus)._M_p != '#') {
        pbVar5 = pbVar5 + 1;
        goto LAB_0018e7dd;
      }
      goto LAB_0018e7f9;
    }
    if (lVar3 == 3) {
      if (*(pbVar5->_M_dataplus)._M_p != '#') {
        pbVar5 = pbVar5 + 1;
        goto LAB_0018e7d1;
      }
      goto LAB_0018e7f9;
    }
LAB_0018e80e:
    local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
    local_a8._M_string_length = 0;
    local_a8.field_2._M_local_buf[0] = '\0';
  }
  std::__cxx11::string::operator=((string *)&className,(string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_a8);
  if (className._M_string_length == 0) {
    std::__cxx11::string::assign((char *)&className);
  }
LAB_0018e853:
  (*(((this->super_CumulativeReporterBase<Catch::JunitReporter>).m_config.
      super___shared_ptr<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    super_NonCopyable)._vptr_NonCopyable[4])(&local_a8);
  sVar2 = local_a8._M_string_length;
  std::__cxx11::string::~string((string *)&local_a8);
  if (sVar2 != 0) {
    (*(((this->super_CumulativeReporterBase<Catch::JunitReporter>).m_config.
        super___shared_ptr<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      super_NonCopyable)._vptr_NonCopyable[4])(&local_48);
    std::operator+(&local_68,&local_48,".");
    std::operator+(&local_a8,&local_68,&className);
    std::__cxx11::string::operator=((string *)&className,(string *)&local_a8);
    std::__cxx11::string::~string((string *)&local_a8);
    std::__cxx11::string::~string((string *)&local_68);
    std::__cxx11::string::~string((string *)&local_48);
  }
  std::__cxx11::string::string((string *)&local_a8,"",(allocator *)&local_68);
  writeSection(this,&className,&local_a8,sectionNode,
               ((testCaseNode->value).testInfo.properties & (MayFail|ShouldFail)) != None);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&className);
  return;
}

Assistant:

void JunitReporter::writeTestCase( TestCaseNode const& testCaseNode ) {
        TestCaseStats const& stats = testCaseNode.value;

        // All test cases have exactly one section - which represents the
        // test case itself. That section may have 0-n nested sections
        assert( testCaseNode.children.size() == 1 );
        SectionNode const& rootSection = *testCaseNode.children.front();

        std::string className = stats.testInfo.className;

        if( className.empty() ) {
            className = fileNameTag(stats.testInfo.tags);
            if ( className.empty() )
                className = "global";
        }

        if ( !m_config->name().empty() )
            className = m_config->name() + "." + className;

        writeSection( className, "", rootSection, stats.testInfo.okToFail() );
    }